

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O3

void __thiscall OpenMD::RippleOP::writeP2(RippleOP *this)

{
  ostream *poVar1;
  ofstream os;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream
            ((ostream *)&local_210,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,
             _S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"#selection1: (",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,(this->selectionScript1_)._M_dataplus._M_p,
                      (this->selectionScript1_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n",0x2a);
  poVar1 = std::ostream::_M_insert<double>((this->avgOPHeadUpper).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>((this->errOPHeadUpper).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::ostream::_M_insert<double>((this->avgOPHeadLower).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>((this->errOPHeadLower).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"selection2: (",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,(this->selectionScript2_)._M_dataplus._M_p,
                      (this->selectionScript2_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n",0x2a);
  poVar1 = std::ostream::_M_insert<double>((this->avgOPTail).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>((this->errOPTail).p2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void RippleOP::writeP2() {
    std::ofstream os(getOutputFileName().c_str());
    os << "#selection1: (" << selectionScript1_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPHeadUpper.p2 << "\t" << errOPHeadUpper.p2 << "\t"
       << avgOPHeadUpper.director[0] << "\t" << avgOPHeadUpper.director[1]
       << "\t" << avgOPHeadUpper.director[2] << "\n";

    os << avgOPHeadLower.p2 << "\t" << errOPHeadLower.p2 << "\t"
       << avgOPHeadLower.director[0] << "\t" << avgOPHeadLower.director[1]
       << "\t" << avgOPHeadLower.director[2] << "\n";

    os << "selection2: (" << selectionScript2_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPTail.p2 << "\t" << errOPTail.p2 << "\t" << avgOPTail.director[0]
       << "\t" << avgOPTail.director[1] << "\t" << avgOPTail.director[2]
       << "\n";
  }